

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS
moving_fixed_point_metric
          (REF_DBL *metric,REF_GRID_conflict ref_grid,REF_INT first_timestep,REF_INT last_timestep,
          REF_INT timestep_increment,char *in_project,char *solb_middle,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p,REF_DBL gradation,REF_DBL complexity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_MPI pRVar4;
  uint uVar5;
  uint uVar6;
  REF_DBL *pRVar7;
  void *pvVar8;
  REF_DBL *pRVar9;
  void *__ptr;
  REF_GLOB *pRVar10;
  long lVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  undefined8 uVar14;
  size_t __size;
  void *pvVar15;
  long lVar16;
  REF_DBL *pRVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  REF_STATUS RVar22;
  ulong uVar23;
  void *pvVar24;
  double dVar25;
  REF_DBL *displaced;
  REF_DBL *scalar;
  REF_INT fixed_point_ldim;
  REF_DBL det;
  char solb_filename [1024];
  uint local_4d4;
  REF_DBL *local_4a8;
  REF_MPI local_4a0;
  void *local_498;
  REF_DBL *local_490;
  REF_DBL *local_488;
  int local_47c;
  REF_INT local_478;
  int local_474;
  REF_DBL *local_470;
  REF_DBL *local_468;
  char *local_460;
  REF_DBL local_458;
  REF_DBL local_450;
  double local_448;
  double local_440;
  char local_438 [1032];
  
  ref_node = ref_grid->node;
  uVar5 = ref_node->max;
  uVar23 = (ulong)uVar5;
  if ((int)uVar5 < 0) {
    pcVar18 = "malloc hess of REF_DBL negative";
    uVar14 = 0xb2f;
LAB_00125f3c:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar14,"moving_fixed_point_metric",pcVar18);
    RVar22 = 1;
  }
  else {
    pRVar4 = ref_grid->mpi;
    local_478 = timestep_increment;
    local_458 = gradation;
    local_450 = complexity;
    pRVar7 = (REF_DBL *)malloc(uVar23 * 0x30);
    if (pRVar7 == (REF_DBL *)0x0) {
      pcVar18 = "malloc hess of REF_DBL NULL";
      uVar14 = 0xb2f;
    }
    else {
      pvVar8 = malloc(uVar23 * 0x30);
      if (pvVar8 == (void *)0x0) {
        pcVar18 = "malloc this_metric of REF_DBL NULL";
        uVar14 = 0xb30;
      }
      else {
        local_498 = pvVar8;
        local_460 = in_project;
        pvVar8 = malloc(uVar23 * 0x48);
        if (pvVar8 == (void *)0x0) {
          pcVar18 = "malloc jac of REF_DBL NULL";
          uVar14 = 0xb31;
        }
        else {
          pRVar9 = (REF_DBL *)malloc(uVar23 * 8);
          if (pRVar9 == (REF_DBL *)0x0) {
            pcVar18 = "malloc x of REF_DBL NULL";
            uVar14 = 0xb32;
          }
          else {
            __size = (ulong)(uVar5 * 3) << 3;
            local_490 = pRVar9;
            pRVar9 = (REF_DBL *)malloc(__size);
            if (pRVar9 == (REF_DBL *)0x0) {
              pcVar18 = "malloc grad of REF_DBL NULL";
              uVar14 = 0xb33;
            }
            else {
              __ptr = malloc(__size);
              if (__ptr != (void *)0x0) {
                local_4a0 = pRVar4;
                if (last_timestep < first_timestep) {
                  iVar21 = 0;
                }
                else {
                  local_468 = pRVar9 + 2;
                  local_448 = 1.0 / (double)(int)reconstruction;
                  iVar21 = 0;
                  local_4d4 = first_timestep;
                  local_470 = metric;
                  do {
                    uVar5 = (uint)uVar23;
                    local_47c = iVar21;
                    snprintf(local_438,0x400,"%s%s%d.solb",local_460,solb_middle,(ulong)local_4d4);
                    if (local_4a0->id == 0) {
                      printf("read and hess recon for %s\n",local_438);
                    }
                    uVar6 = ref_part_scalar(ref_grid,&local_474,&local_488,local_438);
                    iVar21 = local_474;
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb3e,"moving_fixed_point_metric",(ulong)uVar6,"unable to load scalar"
                            );
                      return uVar6;
                    }
                    if ((long)local_474 != 4) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb3f,"moving_fixed_point_metric","expected x,y,z and one scalar",4,
                             (long)local_474);
                      uVar5 = 1;
                    }
                    if (iVar21 != 4) {
                      return uVar5;
                    }
                    uVar6 = extract_displaced_xyz(ref_node,&local_474,&local_488,&local_4a8);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb41,"moving_fixed_point_metric",(ulong)uVar6,"disp");
                      return uVar6;
                    }
                    if ((ref_grid->twod != 0) && (iVar21 = ref_node->max, 0 < (long)iVar21)) {
                      pRVar10 = ref_node->global;
                      pRVar17 = local_4a8 + 2;
                      lVar11 = 0;
                      do {
                        if (-1 < pRVar10[lVar11]) {
                          pRVar17[-1] = *pRVar17;
                          *pRVar17 = 0.0;
                        }
                        lVar11 = lVar11 + 1;
                        pRVar17 = pRVar17 + 3;
                      } while (iVar21 != lVar11);
                    }
                    uVar23 = 0;
                    lVar11 = 0;
                    pRVar17 = local_4a8;
                    do {
                      iVar21 = ref_node->max;
                      if (0 < (long)iVar21) {
                        pRVar10 = ref_node->global;
                        lVar16 = 0;
                        pRVar12 = pRVar17;
                        do {
                          if (-1 < pRVar10[lVar16]) {
                            local_490[lVar16] = *pRVar12;
                          }
                          lVar16 = lVar16 + 1;
                          pRVar12 = pRVar12 + 3;
                        } while (iVar21 != lVar16);
                      }
                      uVar6 = ref_recon_gradient(ref_grid,local_490,pRVar9,REF_RECON_L2PROJECTION);
                      metric = local_470;
                      if (uVar6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0xb4c,"moving_fixed_point_metric",(ulong)uVar6,"recon x");
                        return uVar6;
                      }
                      if ((ref_grid->twod != 0) && (iVar21 = ref_node->max, 0 < (long)iVar21)) {
                        pRVar10 = ref_node->global;
                        lVar16 = 0;
                        pRVar12 = local_468;
                        do {
                          if (-1 < pRVar10[lVar16]) {
                            *pRVar12 = 1.0;
                          }
                          lVar16 = lVar16 + 1;
                          pRVar12 = pRVar12 + 3;
                        } while (iVar21 != lVar16);
                      }
                      iVar21 = ref_node->max;
                      if (0 < (long)iVar21) {
                        pRVar10 = ref_node->global;
                        uVar20 = 0;
                        uVar13 = uVar23;
                        do {
                          if (-1 < *pRVar10) {
                            *(undefined8 *)((long)pvVar8 + (uVar13 & 0x7fffffff8) + 0x10) =
                                 *(undefined8 *)((long)pRVar9 + (uVar20 & 0x7fffffff8) + 0x10);
                            puVar1 = (undefined8 *)((long)pRVar9 + (uVar20 & 0x7fffffff8));
                            uVar14 = puVar1[1];
                            puVar2 = (undefined8 *)((long)pvVar8 + (uVar13 & 0x7fffffff8));
                            *puVar2 = *puVar1;
                            puVar2[1] = uVar14;
                          }
                          uVar20 = uVar20 + 0x18;
                          uVar13 = uVar13 + 0x48;
                          pRVar10 = pRVar10 + 1;
                        } while ((long)iVar21 * 0x18 != uVar20);
                      }
                      lVar11 = lVar11 + 1;
                      pRVar17 = pRVar17 + 1;
                      uVar23 = uVar23 + 0x18;
                    } while (lVar11 != 3);
                    iVar21 = ref_node->max;
                    if (0 < (long)iVar21) {
                      pRVar10 = ref_node->global;
                      lVar16 = 0;
                      lVar11 = 0;
                      pRVar17 = local_4a8;
                      pvVar15 = __ptr;
                      do {
                        if (-1 < pRVar10[lVar11]) {
                          pRVar12 = ref_node->real;
                          lVar19 = 0;
                          do {
                            *(undefined8 *)((long)pvVar15 + lVar19 * 8) =
                                 *(undefined8 *)((long)pRVar12 + lVar19 * 8 + lVar16);
                            *(REF_DBL *)((long)pRVar12 + lVar19 * 8 + lVar16) = pRVar17[lVar19];
                            lVar19 = lVar19 + 1;
                          } while (lVar19 != 3);
                        }
                        lVar11 = lVar11 + 1;
                        lVar16 = lVar16 + 0x78;
                        pRVar17 = pRVar17 + 3;
                        pvVar15 = (void *)((long)pvVar15 + 0x18);
                      } while (lVar11 != iVar21);
                    }
                    uVar6 = ref_recon_hessian(ref_grid,local_488,pRVar7,REF_RECON_L2PROJECTION);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb5d,"moving_fixed_point_metric",(ulong)uVar6,"hess");
                      return uVar6;
                    }
                    uVar6 = ref_recon_roundoff_limit(pRVar7,ref_grid);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb5f,"moving_fixed_point_metric",(ulong)uVar6,
                             "floor metric eigenvalues based on grid size and solution jitter");
                      return uVar6;
                    }
                    iVar21 = ref_node->max;
                    if (0 < (long)iVar21) {
                      pRVar10 = ref_node->global;
                      lVar11 = 0;
                      do {
                        if (-1 < pRVar10[lVar11]) {
                          uVar23 = lVar11 * 0x18 & 0x7fffffff8;
                          uVar13 = lVar11 * 0x78 & 0x7fffffff8;
                          pRVar17 = ref_node->real;
                          *(undefined8 *)((long)pRVar17 + uVar13 + 0x10) =
                               *(undefined8 *)((long)__ptr + uVar23 + 0x10);
                          puVar1 = (undefined8 *)((long)__ptr + uVar23);
                          uVar14 = puVar1[1];
                          puVar2 = (undefined8 *)((long)pRVar17 + uVar13);
                          *puVar2 = *puVar1;
                          puVar2[1] = uVar14;
                        }
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != iVar21);
                    }
                    uVar6 = ref_node->max;
                    pvVar15 = local_498;
                    if (0 < (int)uVar6) {
                      lVar11 = 0;
                      pvVar24 = local_498;
                      do {
                        if (-1 < ref_node->global[lVar11]) {
                          pRVar17 = (REF_DBL *)(lVar11 * 0x48 + (long)pvVar8);
                          uVar6 = ref_matrix_jac_m_jact
                                            (pRVar17,pRVar7 + lVar11 * 6,
                                             (REF_DBL *)(lVar11 * 0x30 + (long)pvVar15));
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0xb69,"moving_fixed_point_metric",(ulong)uVar6,"J M J^t");
                            return uVar6;
                          }
                          uVar6 = ref_matrix_det_gen(3,pRVar17,&local_440);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0xb6b,"moving_fixed_point_metric",(ulong)uVar6,"gen det");
                            return uVar6;
                          }
                          lVar16 = 0;
                          do {
                            dVar25 = local_440;
                            if (local_440 <= -local_440) {
                              dVar25 = -local_440;
                            }
                            dVar25 = pow(dVar25,local_448);
                            *(double *)((long)pvVar24 + lVar16 * 8) =
                                 dVar25 * *(double *)((long)pvVar24 + lVar16 * 8);
                            lVar16 = lVar16 + 1;
                            pvVar15 = local_498;
                          } while (lVar16 != 6);
                        }
                        lVar11 = lVar11 + 1;
                        uVar6 = ref_node->max;
                        pvVar24 = (void *)((long)pvVar24 + 0x30);
                        metric = local_470;
                      } while (lVar11 < (int)uVar6);
                    }
                    uVar23 = (ulong)uVar5;
                    if (0 < (int)uVar6) {
                      pRVar10 = ref_node->global;
                      uVar13 = 0;
                      pRVar17 = metric;
                      do {
                        if (-1 < pRVar10[uVar13]) {
                          lVar11 = 0;
                          do {
                            pRVar17[lVar11] =
                                 *(double *)((long)pvVar15 + lVar11 * 8) + pRVar17[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 6);
                        }
                        uVar13 = uVar13 + 1;
                        pRVar17 = pRVar17 + 6;
                        pvVar15 = (void *)((long)pvVar15 + 0x30);
                      } while (uVar13 != uVar6);
                    }
                    if (local_4a8 != (REF_DBL *)0x0) {
                      free(local_4a8);
                    }
                    if (local_488 != (REF_DBL *)0x0) {
                      free(local_488);
                    }
                    iVar21 = local_47c + 1;
                    local_4d4 = local_4d4 + local_478;
                  } while ((int)local_4d4 <= last_timestep);
                }
                free(__ptr);
                free(pRVar9);
                free(local_490);
                free(pvVar8);
                free(local_498);
                free(pRVar7);
                ref_mpi_stopwatch_stop(local_4a0,"all timesteps processed");
                if (iVar21 != 0) {
                  iVar3 = ref_node->max;
                  if (0 < (long)iVar3) {
                    pRVar10 = ref_node->global;
                    lVar11 = 0;
                    pRVar7 = metric;
                    do {
                      if (-1 < pRVar10[lVar11]) {
                        lVar16 = 0;
                        do {
                          pRVar7[lVar16] = pRVar7[lVar16] * (1.0 / (double)iVar21);
                          lVar16 = lVar16 + 1;
                        } while (lVar16 != 6);
                      }
                      lVar11 = lVar11 + 1;
                      pRVar7 = pRVar7 + 6;
                    } while (lVar11 != iVar3);
                  }
                  uVar5 = ref_recon_roundoff_limit(metric,ref_grid);
                  pRVar4 = local_4a0;
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb8b,"moving_fixed_point_metric",(ulong)uVar5,
                           "floor metric eigenvalues based on grid size and solution jitter");
                    return uVar5;
                  }
                  uVar5 = ref_metric_local_scale(metric,ref_grid,reconstruction);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb8c,"moving_fixed_point_metric",(ulong)uVar5,"local lp norm scaling");
                    return uVar5;
                  }
                  ref_mpi_stopwatch_stop(pRVar4,"local scale metric");
                  uVar5 = ref_metric_gradation_at_complexity(metric,ref_grid,local_458,local_450);
                  if (uVar5 == 0) {
                    ref_mpi_stopwatch_stop(pRVar4,"metric gradation and complexity");
                    return 0;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0xb90,"moving_fixed_point_metric",(ulong)uVar5,"gradation at complexity");
                  return uVar5;
                }
                pcVar18 = "expected one or more timesteps";
                uVar14 = 0xb83;
                goto LAB_00125f3c;
              }
              pcVar18 = "malloc xyz of REF_DBL NULL";
              uVar14 = 0xb34;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar14,"moving_fixed_point_metric",pcVar18);
    RVar22 = 2;
  }
  return RVar22;
}

Assistant:

static REF_STATUS moving_fixed_point_metric(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT first_timestep,
    REF_INT last_timestep, REF_INT timestep_increment, const char *in_project,
    const char *solb_middle, REF_RECON_RECONSTRUCTION reconstruction, REF_INT p,
    REF_DBL gradation, REF_DBL complexity) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *hess, *scalar;
  REF_DBL *jac, *x, *grad, *this_metric, *xyz, det;
  REF_INT timestep, total_timesteps;
  char solb_filename[1024];
  REF_DBL inv_total;
  REF_INT im, node;
  REF_INT fixed_point_ldim;
  REF_DBL *displaced;
  REF_INT i, j;

  ref_malloc(hess, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(this_metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(x, ref_node_max(ref_node), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(xyz, 3 * ref_node_max(ref_node), REF_DBL);

  total_timesteps = 0;
  for (timestep = first_timestep; timestep <= last_timestep;
       timestep += timestep_increment) {
    snprintf(solb_filename, 1024, "%s%s%d.solb", in_project, solb_middle,
             timestep);
    if (ref_mpi_once(ref_mpi))
      printf("read and hess recon for %s\n", solb_filename);
    RSS(ref_part_scalar(ref_grid, &fixed_point_ldim, &scalar, solb_filename),
        "unable to load scalar");
    REIS(4, fixed_point_ldim, "expected x,y,z and one scalar");
    RSS(extract_displaced_xyz(ref_node, &fixed_point_ldim, &scalar, &displaced),
        "disp");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        displaced[1 + 3 * node] = displaced[2 + 3 * node];
        displaced[2 + 3 * node] = 0.0;
      }
    }
    for (j = 0; j < 3; j++) {
      each_ref_node_valid_node(ref_node, node) {
        x[node] = displaced[j + 3 * node];
      }
      RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
      if (ref_grid_twod(ref_grid)) {
        each_ref_node_valid_node(ref_node, node) { grad[2 + 3 * node] = 1.0; }
      }
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 3; i++) {
          jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
        }
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
        ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
      }
    }
    RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "hess");
    RSS(ref_recon_roundoff_limit(hess, ref_grid),
        "floor metric eigenvalues based on grid size and solution jitter");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                                &(this_metric[6 * node])),
          "J M J^t");

      RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
      for (i = 0; i < 6; i++) {
        this_metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p);
      }
    }

    total_timesteps++;
    each_ref_node_valid_node(ref_node, node) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] += this_metric[im + 6 * node];
      }
    }

    ref_free(displaced);
    ref_free(scalar);
  }
  free(xyz);
  free(grad);
  free(x);
  free(jac);
  free(this_metric);
  free(hess);
  ref_mpi_stopwatch_stop(ref_mpi, "all timesteps processed");

  RAS(0 < total_timesteps, "expected one or more timesteps");
  inv_total = 1.0 / (REF_DBL)total_timesteps;
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) {
      metric[im + 6 * node] *= inv_total;
    }
  }
  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p), "local lp norm scaling");
  ref_mpi_stopwatch_stop(ref_mpi, "local scale metric");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");
  ref_mpi_stopwatch_stop(ref_mpi, "metric gradation and complexity");
  return REF_SUCCESS;
}